

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OFFLoader.cpp
# Opt level: O3

bool __thiscall
Assimp::OFFImporter::CanRead(OFFImporter *this,string *pFile,IOSystem *pIOHandler,bool checkSig)

{
  bool bVar1;
  int iVar2;
  string extension;
  char *tokens [1];
  string local_50;
  char *local_30;
  
  BaseImporter::GetExtension(&local_50,pFile);
  iVar2 = std::__cxx11::string::compare((char *)&local_50);
  bVar1 = true;
  if (iVar2 != 0) {
    if (local_50._M_string_length == 0 || checkSig) {
      if (pIOHandler != (IOSystem *)0x0) {
        local_30 = "off";
        bVar1 = BaseImporter::SearchFileHeaderForToken(pIOHandler,pFile,&local_30,1,3,false,false);
      }
    }
    else {
      bVar1 = false;
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return bVar1;
}

Assistant:

bool OFFImporter::CanRead( const std::string& pFile, IOSystem* pIOHandler, bool checkSig) const
{
    const std::string extension = GetExtension(pFile);

    if (extension == "off")
        return true;
    else if (!extension.length() || checkSig)
    {
        if (!pIOHandler)return true;
        const char* tokens[] = {"off"};
        return SearchFileHeaderForToken(pIOHandler,pFile,tokens,1,3);
    }
    return false;
}